

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependDouble
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,double value)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  BufferBuilder *pBVar2;
  ImmutableList<Js::BufferBuilder_*> *pIVar3;
  
  pBVar2 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x364470);
  pBVar2->clue = clue;
  pBVar2->offset = 0xffffffff;
  pBVar2[1]._vptr_BufferBuilder = (_func_int **)value;
  pBVar2->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014ddba8;
  pIVar1 = builder->list;
  pIVar3 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
  pIVar3->value = pBVar2;
  pIVar3->next = pIVar1;
  builder->list = pIVar3;
  return 8;
}

Assistant:

uint32 PrependDouble(BufferBuilderList & builder, LPCWSTR clue, double value)
    {
        auto entry = Anew(alloc, BufferBuilderDouble, clue, value);
        builder.list = builder.list->Prepend(entry, alloc);
        return sizeof(double);
    }